

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_buffer_block_flattened
          (CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  CompilerError *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  undefined1 local_1e8 [8];
  Bitset flags;
  SPIRType tmp;
  BaseType basic_type;
  ulong local_48;
  size_t buffer_size;
  string buffer_name;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  buffer_name.field_2._8_8_ =
       Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(((SPIRType *)buffer_name.field_2._8_8_)->super_IVariant).self);
  (*(this->super_Compiler)._vptr_Compiler[6])(&buffer_size,this,(ulong)uVar2,0);
  sVar3 = Compiler::get_declared_struct_size
                    (&this->super_Compiler,(SPIRType *)buffer_name.field_2._8_8_);
  local_48 = sVar3 + 0xf >> 4;
  bVar1 = Compiler::get_common_basic_type
                    (&this->super_Compiler,(SPIRType *)buffer_name.field_2._8_8_,
                     (BaseType *)&tmp.member_name_cache._M_h._M_single_bucket);
  if (!bVar1) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar4,"All basic types in a flattened block must be the same.");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  SPIRType::SPIRType((SPIRType *)&flags.higher._M_h._M_single_bucket,OpTypeVector);
  tmp.super_IVariant.self.id = (uint32_t)tmp.member_name_cache._M_h._M_single_bucket;
  tmp.basetype = UByte;
  if ((((uint32_t)tmp.member_name_cache._M_h._M_single_bucket != 0xd) &&
      ((uint32_t)tmp.member_name_cache._M_h._M_single_bucket != 7)) &&
     ((uint32_t)tmp.member_name_cache._M_h._M_single_bucket != 8)) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar4,"Basic types in a flattened UBO must be float, int or uint.");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  ParsedIR::get_buffer_block_flags((Bitset *)local_1e8,&(this->super_Compiler).ir,var);
  flags_to_qualifiers_glsl_abi_cxx11_
            (&local_208,this,(SPIRType *)&flags.higher._M_h._M_single_bucket,(Bitset *)local_1e8);
  (*(this->super_Compiler)._vptr_Compiler[0x13])
            (&local_228,this,&flags.higher._M_h._M_single_bucket,0);
  statement<char_const(&)[9],std::__cxx11::string,std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_long&,char_const(&)[3]>
            (this,(char (*) [9])0xe61fc5,&local_208,&local_228,(char (*) [2])0xf43b35,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer_size,
             (char (*) [2])0xf54f20,&local_48,(char (*) [3])0xf61b4b);
  ::std::__cxx11::string::~string((string *)&local_228);
  ::std::__cxx11::string::~string((string *)&local_208);
  Bitset::~Bitset((Bitset *)local_1e8);
  SPIRType::~SPIRType((SPIRType *)&flags.higher._M_h._M_single_bucket);
  ::std::__cxx11::string::~string((string *)&buffer_size);
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_block_flattened(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	// Block names should never alias.
	auto buffer_name = to_name(type.self, false);
	size_t buffer_size = (get_declared_struct_size(type) + 15) / 16;

	SPIRType::BaseType basic_type;
	if (get_common_basic_type(type, basic_type))
	{
		SPIRType tmp { OpTypeVector };
		tmp.basetype = basic_type;
		tmp.vecsize = 4;
		if (basic_type != SPIRType::Float && basic_type != SPIRType::Int && basic_type != SPIRType::UInt)
			SPIRV_CROSS_THROW("Basic types in a flattened UBO must be float, int or uint.");

		auto flags = ir.get_buffer_block_flags(var);
		statement("uniform ", flags_to_qualifiers_glsl(tmp, flags), type_to_glsl(tmp), " ", buffer_name, "[",
		          buffer_size, "];");
	}
	else
		SPIRV_CROSS_THROW("All basic types in a flattened block must be the same.");
}